

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membrane.c++
# Opt level: O0

Client __thiscall
capnp::reverseMembrane(capnp *this,Client *inner,Own<capnp::MembranePolicy> *policy)

{
  Client *pCVar1;
  RefOrVoid<capnp::MembranePolicy> policy_00;
  ClientHook *extraout_RDX;
  Client CVar2;
  Client local_50;
  Own<capnp::ClientHook> local_40;
  Own<capnp::ClientHook> local_30;
  Own<capnp::MembranePolicy> *local_20;
  Own<capnp::MembranePolicy> *policy_local;
  Client *inner_local;
  
  local_20 = policy;
  policy_local = (Own<capnp::MembranePolicy> *)inner;
  inner_local = (Client *)this;
  pCVar1 = kj::mv<capnp::Capability::Client>(inner);
  Capability::Client::Client(&local_50,pCVar1);
  ClientHook::from((ClientHook *)&local_40,&local_50);
  policy_00 = kj::Own<capnp::MembranePolicy>::operator*(policy);
  anon_unknown_0::membrane((anon_unknown_0 *)&local_30,&local_40,policy_00,true);
  Capability::Client::Client((Client *)this,&local_30);
  kj::Own<capnp::ClientHook>::~Own(&local_30);
  kj::Own<capnp::ClientHook>::~Own(&local_40);
  Capability::Client::~Client(&local_50);
  CVar2.hook.ptr = extraout_RDX;
  CVar2.hook.disposer = (Disposer *)this;
  return (Client)CVar2.hook;
}

Assistant:

Capability::Client reverseMembrane(Capability::Client inner, kj::Own<MembranePolicy> policy) {
  return Capability::Client(membrane(
      ClientHook::from(kj::mv(inner)), *policy, true));
}